

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v8::detail::bigint::assign(bigint *this,bigint *other)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar1) {
    (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this,uVar1);
    uVar2 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
    if (uVar1 <= uVar2) {
      uVar2 = uVar1;
    }
    (this->bigits_).super_buffer<unsigned_int>.size_ = uVar2;
  }
  else {
    (this->bigits_).super_buffer<unsigned_int>.size_ = uVar1;
    if (uVar1 == 0) goto LAB_0012a532;
  }
  memmove((this->bigits_).super_buffer<unsigned_int>.ptr_,
          (other->bigits_).super_buffer<unsigned_int>.ptr_,uVar1 << 2);
LAB_0012a532:
  this->exp_ = other->exp_;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    std::copy(data, data + size, make_checked(bigits_.data(), size));
    exp_ = other.exp_;
  }